

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O1

int consume_markers(j_decompress_ptr cinfo)

{
  jpeg_input_controller *pjVar1;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int *piVar7;
  
  pjVar1 = cinfo->inputctl;
  iVar3 = 2;
  if (pjVar1->eoi_reached == 0) {
    do {
      while( true ) {
        iVar3 = (*cinfo->marker->read_markers)(cinfo);
        if (iVar3 != 1) {
          if (iVar3 != 2) {
            return iVar3;
          }
          pjVar1->eoi_reached = 1;
          if (*(int *)&pjVar1[1].consume_input != 0) {
            if (cinfo->marker->saw_SOF == 0) {
              return 2;
            }
            pjVar2 = cinfo->err;
            pjVar2->msg_code = 0x3d;
            (*pjVar2->error_exit)((j_common_ptr)cinfo);
            return 2;
          }
          if (cinfo->output_scan_number <= cinfo->input_scan_number) {
            return 2;
          }
          cinfo->output_scan_number = cinfo->input_scan_number;
          return 2;
        }
        if (*(int *)&pjVar1[1].consume_input == 0) break;
        if (*(int *)&pjVar1[1].consume_input == 1) {
          if ((0xffdc < cinfo->image_height) || (0xffdc < cinfo->image_width)) {
            *(undefined8 *)&cinfo->err->msg_code = 0xffdc0000002a;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          iVar3 = cinfo->data_precision;
          if (iVar3 != 8) {
            pjVar2 = cinfo->err;
            pjVar2->msg_code = 0x10;
            (pjVar2->msg_parm).i[0] = iVar3;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          iVar3 = cinfo->num_components;
          if (10 < iVar3) {
            pjVar2 = cinfo->err;
            pjVar2->msg_code = 0x1b;
            (pjVar2->msg_parm).i[0] = iVar3;
            (cinfo->err->msg_parm).i[1] = 10;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          cinfo->max_h_samp_factor = 1;
          cinfo->max_v_samp_factor = 1;
          if (0 < cinfo->num_components) {
            piVar7 = &cinfo->comp_info->v_samp_factor;
            iVar3 = 0;
            do {
              if ((piVar7[-1] - 5U < 0xfffffffc) || (*piVar7 - 5U < 0xfffffffc)) {
                pjVar2 = cinfo->err;
                pjVar2->msg_code = 0x13;
                (*pjVar2->error_exit)((j_common_ptr)cinfo);
              }
              iVar4 = piVar7[-1];
              if (piVar7[-1] < cinfo->max_h_samp_factor) {
                iVar4 = cinfo->max_h_samp_factor;
              }
              cinfo->max_h_samp_factor = iVar4;
              iVar4 = *piVar7;
              if (*piVar7 < cinfo->max_v_samp_factor) {
                iVar4 = cinfo->max_v_samp_factor;
              }
              cinfo->max_v_samp_factor = iVar4;
              iVar3 = iVar3 + 1;
              piVar7 = piVar7 + 0x18;
            } while (iVar3 < cinfo->num_components);
          }
          if ((cinfo->is_baseline == 0) &&
             ((cinfo->progressive_mode == 0 || (cinfo->comps_in_scan == 0)))) {
            iVar3 = cinfo->Se;
            if (0x4f < iVar3) {
              if (iVar3 < 0xa8) {
                if (iVar3 < 0x78) {
                  if (iVar3 == 0x50) {
                    cinfo->block_size = 9;
                  }
                  else {
                    if (iVar3 != 99) goto LAB_0027ab7f;
                    cinfo->block_size = 10;
                  }
                }
                else if (iVar3 == 0x78) {
                  cinfo->block_size = 0xb;
                }
                else {
                  if (iVar3 != 0x8f) goto LAB_0027ab7f;
                  cinfo->block_size = 0xc;
                }
              }
              else if (iVar3 < 0xe0) {
                if (iVar3 == 0xa8) {
                  cinfo->block_size = 0xd;
                }
                else {
                  if (iVar3 != 0xc3) goto LAB_0027ab7f;
                  cinfo->block_size = 0xe;
                }
              }
              else if (iVar3 == 0xe0) {
                cinfo->block_size = 0xf;
              }
              else {
                if (iVar3 != 0xff) goto LAB_0027ab7f;
                cinfo->block_size = 0x10;
              }
              goto LAB_0027a7d8;
            }
            if (iVar3 < 0x18) {
              if (iVar3 < 8) {
                if (iVar3 == 0) {
                  cinfo->block_size = 1;
                  piVar7 = jpeg_natural_order;
                }
                else {
                  if (iVar3 != 3) goto LAB_0027ab7f;
                  cinfo->block_size = 2;
                  piVar7 = jpeg_natural_order2;
                }
              }
              else if (iVar3 == 8) {
                cinfo->block_size = 3;
                piVar7 = jpeg_natural_order3;
              }
              else {
                if (iVar3 != 0xf) goto LAB_0027ab7f;
                cinfo->block_size = 4;
                piVar7 = jpeg_natural_order4;
              }
LAB_0027ab5c:
              cinfo->natural_order = piVar7;
              cinfo->lim_Se = iVar3;
            }
            else {
              if (iVar3 < 0x30) {
                if (iVar3 == 0x18) {
                  cinfo->block_size = 5;
                  piVar7 = jpeg_natural_order5;
                }
                else {
                  if (iVar3 != 0x23) goto LAB_0027ab7f;
                  cinfo->block_size = 6;
                  piVar7 = jpeg_natural_order6;
                }
                goto LAB_0027ab5c;
              }
              if (iVar3 == 0x30) {
                cinfo->block_size = 7;
                piVar7 = jpeg_natural_order7;
                goto LAB_0027ab5c;
              }
              if (iVar3 == 0x3f) goto LAB_0027a7cd;
LAB_0027ab7f:
              pjVar2 = cinfo->err;
              pjVar2->msg_code = 0x11;
              (pjVar2->msg_parm).i[0] = cinfo->Ss;
              (cinfo->err->msg_parm).i[1] = cinfo->Se;
              (cinfo->err->msg_parm).i[2] = cinfo->Ah;
              (cinfo->err->msg_parm).i[3] = cinfo->Al;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
          }
          else {
LAB_0027a7cd:
            cinfo->block_size = 8;
LAB_0027a7d8:
            cinfo->natural_order = jpeg_natural_order;
            cinfo->lim_Se = 0x3f;
          }
          cinfo->min_DCT_h_scaled_size = cinfo->block_size;
          cinfo->min_DCT_v_scaled_size = cinfo->block_size;
          if (0 < cinfo->num_components) {
            piVar7 = &cinfo->comp_info->h_samp_factor;
            iVar3 = 0;
            do {
              iVar4 = cinfo->block_size;
              piVar7[7] = iVar4;
              piVar7[8] = iVar4;
              lVar6 = jdiv_round_up((long)*piVar7 * (ulong)cinfo->image_width,
                                    (long)cinfo->max_h_samp_factor * (long)iVar4);
              piVar7[5] = (JDIMENSION)lVar6;
              lVar6 = jdiv_round_up((long)piVar7[1] * (ulong)cinfo->image_height,
                                    (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
              piVar7[6] = (JDIMENSION)lVar6;
              lVar6 = jdiv_round_up((long)*piVar7 * (ulong)cinfo->image_width,
                                    (long)cinfo->max_h_samp_factor);
              piVar7[9] = (JDIMENSION)lVar6;
              lVar6 = jdiv_round_up((long)piVar7[1] * (ulong)cinfo->image_height,
                                    (long)cinfo->max_v_samp_factor);
              piVar7[10] = (JDIMENSION)lVar6;
              piVar7[0xb] = 1;
              *(JQUANT_TBL **)(piVar7 + 0x12) = (JQUANT_TBL *)0x0;
              iVar3 = iVar3 + 1;
              piVar7 = piVar7 + 0x18;
            } while (iVar3 < cinfo->num_components);
          }
          lVar6 = jdiv_round_up((ulong)cinfo->image_height,
                                (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
          cinfo->total_iMCU_rows = (JDIMENSION)lVar6;
          uVar5 = 1;
          if (cinfo->num_components <= cinfo->comps_in_scan) {
            uVar5 = (uint)(cinfo->progressive_mode != 0);
          }
          cinfo->inputctl->has_multiple_scans = uVar5;
        }
        if (cinfo->comps_in_scan != 0) {
          *(undefined4 *)&pjVar1[1].consume_input = 0;
          goto LAB_0027ac39;
        }
        *(undefined4 *)&pjVar1[1].consume_input = 2;
      }
      if (pjVar1->has_multiple_scans == 0) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x24;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
    } while (cinfo->comps_in_scan == 0);
    start_input_pass(cinfo);
LAB_0027ac39:
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

METHODDEF(int)
consume_markers (j_decompress_ptr cinfo)
{
  my_inputctl_ptr inputctl = (my_inputctl_ptr) cinfo->inputctl;
  int val;

  if (inputctl->pub.eoi_reached) /* After hitting EOI, read no further */
    return JPEG_REACHED_EOI;

  for (;;) {			/* Loop to pass pseudo SOS marker */
    val = (*cinfo->marker->read_markers) (cinfo);

    switch (val) {
    case JPEG_REACHED_SOS:	/* Found SOS */
      if (inputctl->inheaders) { /* 1st SOS */
	if (inputctl->inheaders == 1)
	  initial_setup(cinfo);
	if (cinfo->comps_in_scan == 0) { /* pseudo SOS marker */
	  inputctl->inheaders = 2;
	  break;
	}
	inputctl->inheaders = 0;
	/* Note: start_input_pass must be called by jdmaster.c
	 * before any more input can be consumed.  jdapimin.c is
	 * responsible for enforcing this sequencing.
	 */
      } else {			/* 2nd or later SOS marker */
	if (! inputctl->pub.has_multiple_scans)
	  ERREXIT(cinfo, JERR_EOI_EXPECTED); /* Oops, I wasn't expecting this! */
	if (cinfo->comps_in_scan == 0) /* unexpected pseudo SOS marker */
	  break;
	start_input_pass(cinfo);
      }
      return val;
    case JPEG_REACHED_EOI:	/* Found EOI */
      inputctl->pub.eoi_reached = TRUE;
      if (inputctl->inheaders) { /* Tables-only datastream, apparently */
	if (cinfo->marker->saw_SOF)
	  ERREXIT(cinfo, JERR_SOF_NO_SOS);
      } else {
	/* Prevent infinite loop in coef ctlr's decompress_data routine
	 * if user set output_scan_number larger than number of scans.
	 */
	if (cinfo->output_scan_number > cinfo->input_scan_number)
	  cinfo->output_scan_number = cinfo->input_scan_number;
      }
      return val;
    case JPEG_SUSPENDED:
      return val;
    default:
      return val;
    }
  }
}